

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointConnection::~IfcStructuralPointConnection
          (IfcStructuralPointConnection *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&this->super_IfcStructuralConnection = 0x91d468;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x140 = 0x91d4e0;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x88 = 0x91d490;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x98 = 0x91d4b8;
  puVar2 = *(undefined1 **)&(this->super_IfcStructuralConnection).field_0xa8;
  puVar1 = &(this->super_IfcStructuralConnection).field_0xb8;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&this->super_IfcStructuralConnection = 0x91d580;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x140 = 0x91d5a8;
  puVar2 = *(undefined1 **)&(this->super_IfcStructuralConnection).field_0x60;
  puVar1 = &(this->super_IfcStructuralConnection).field_0x70;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcStructuralConnection).field_0x38;
  puVar1 = &(this->super_IfcStructuralConnection).field_0x48;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcStructuralConnection).field_0x10;
  puVar2 = &(this->super_IfcStructuralConnection).field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
    return;
  }
  return;
}

Assistant:

IfcStructuralPointConnection() : Object("IfcStructuralPointConnection") {}